

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_steal(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CClass *this;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var9;
  int gold;
  char query [4608];
  int chance;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  undefined4 in_stack_ffffffffffffb728;
  int in_stack_ffffffffffffb72c;
  int in_stack_ffffffffffffb730;
  int in_stack_ffffffffffffb734;
  undefined4 in_stack_ffffffffffffb738;
  int in_stack_ffffffffffffb73c;
  char_data *in_stack_ffffffffffffb740;
  CHAR_DATA *in_stack_ffffffffffffb748;
  OBJ_DATA *in_stack_ffffffffffffb750;
  undefined8 in_stack_ffffffffffffb758;
  undefined4 in_stack_ffffffffffffb760;
  undefined4 in_stack_ffffffffffffb764;
  char *local_4878;
  uint local_4840;
  int local_483c [16];
  int in_stack_ffffffffffffb804;
  undefined1 in_stack_ffffffffffffb80b;
  int in_stack_ffffffffffffb80c;
  CHAR_DATA *in_stack_ffffffffffffb810;
  int in_stack_ffffffffffffb82c;
  CHAR_DATA *in_stack_ffffffffffffb830;
  int in_stack_ffffffffffffb954;
  CHAR_DATA *in_stack_ffffffffffffb958;
  CHAR_DATA *in_stack_ffffffffffffb960;
  char *in_stack_ffffffffffffc930;
  CHAR_DATA *in_stack_ffffffffffffc938;
  char *in_stack_ffffffffffffc940;
  CHAR_DATA *in_stack_ffffffffffffc948;
  CHAR_DATA *in_stack_ffffffffffffc950;
  undefined4 in_stack_ffffffffffffc978;
  int in_stack_ffffffffffffc97c;
  CHAR_DATA *in_stack_ffffffffffffc980;
  long in_stack_ffffffffffffc988;
  OBJ_DATA *in_stack_ffffffffffffc990;
  CHAR_DATA *in_stack_ffffffffffffc998;
  char *in_stack_ffffffffffffc9a0;
  int local_362c;
  OBJ_DATA *local_3628;
  CHAR_DATA *local_3620;
  char local_3618;
  undefined1 in_stack_ffffffffffffcaa2;
  undefined1 in_stack_ffffffffffffcaa3;
  int in_stack_ffffffffffffcaa4;
  int in_stack_ffffffffffffcaa8;
  int in_stack_ffffffffffffcaac;
  CHAR_DATA *in_stack_ffffffffffffcab0;
  CHAR_DATA *in_stack_ffffffffffffcab8;
  int in_stack_ffffffffffffcad8;
  int in_stack_ffffffffffffcae0;
  char *in_stack_ffffffffffffcae8;
  char local_2418 [4608];
  char local_1218 [4616];
  char *local_10;
  CHAR_DATA *local_8;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffb758 >> 0x20);
  local_8 = in_RDI;
  iVar4 = get_skill(in_stack_ffffffffffffb830,in_stack_ffffffffffffb82c);
  if (iVar4 != 0) {
    sVar1 = local_8->level;
    lVar8 = (long)gsn_steal;
    this = char_data::Class(in_stack_ffffffffffffb740);
    iVar4 = CClass::GetIndex(this);
    if (*(short *)(lVar8 * 0x60 + 0x8daef8 + (long)iVar4 * 2) <= sVar1) {
      local_10 = one_argument((char *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730),
                              (char *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728))
      ;
      local_10 = one_argument((char *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730),
                              (char *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728))
      ;
      if ((local_2418[0] == '\0') || (local_3618 == '\0')) {
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        return;
      }
      local_3620 = get_char_room(in_stack_ffffffffffffc938,in_stack_ffffffffffffc930);
      if (local_3620 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        return;
      }
      if (local_3620 == local_8) {
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        return;
      }
      bVar3 = is_safe((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730),
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
      if (bVar3) {
        return;
      }
      if (local_3620->fighting != (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        return;
      }
      bVar3 = is_cabal_guard((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
      if (bVar3) {
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        return;
      }
      check_keen_vision(in_stack_ffffffffffffc950,in_stack_ffffffffffffc948);
      WAIT_STATE(in_stack_ffffffffffffb740,in_stack_ffffffffffffb73c);
      local_362c = get_skill(in_stack_ffffffffffffb830,in_stack_ffffffffffffb82c);
      local_362c = local_362c / 2;
      iVar4 = get_curr_stat((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffb764,in_stack_ffffffffffffb760),iVar5);
      local_362c = (iVar4 + -0x14) * 5 + local_362c;
      bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
      if (bVar3) {
        iVar4 = ((int)local_3620->level - (int)local_8->level) * -5;
      }
      else {
        iVar4 = ((int)local_3620->level - (int)local_8->level) * -2;
      }
      local_362c = local_362c + iVar4;
      bVar3 = can_see(in_stack_ffffffffffffb748,in_stack_ffffffffffffb740);
      if (bVar3) {
        local_362c = local_362c + -0x19;
      }
      else {
        local_362c = local_362c + 5;
      }
      bVar3 = is_affected_by((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
                             in_stack_ffffffffffffb734);
      if (!bVar3) {
        local_362c = local_362c + -10;
      }
      bVar3 = is_awake(local_3620);
      if (bVar3) {
        iVar4 = get_curr_stat((CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffb764,in_stack_ffffffffffffb760),iVar5);
        local_362c = local_362c + (iVar4 + -0xf) * -2;
      }
      else {
        local_362c = local_362c + 0x19;
      }
      char_data::Class(in_stack_ffffffffffffb740);
      bVar3 = RString::operator==((RString *)
                                  CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730),
                                  (char *)CONCAT44(in_stack_ffffffffffffb72c,
                                                   in_stack_ffffffffffffb728));
      if (bVar3) {
        local_483c[0] = 0x28;
        piVar6 = std::max<int>(local_483c,&local_362c);
        local_362c = *piVar6;
      }
      bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
      if ((bVar3) && (local_3620->pIndexData->pShop != (SHOP_DATA *)0x0)) {
        local_362c = 0;
      }
      iVar4 = get_trust((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
      if (0x3a < iVar4) {
        local_362c = 100;
      }
      iVar4 = number_percent();
      if (local_362c < iVar4) {
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        affect_strip(in_stack_ffffffffffffb740,in_stack_ffffffffffffb73c);
        _Var9 = std::pow<int,int>(0,0x57adc1);
        local_8->affected_by[0] = ((long)_Var9 ^ 0xffffffffffffffffU) & local_8->affected_by[0];
        check_improve(in_stack_ffffffffffffb810,in_stack_ffffffffffffb80c,
                      (bool)in_stack_ffffffffffffb80b,in_stack_ffffffffffffb804);
        act((char *)in_stack_ffffffffffffb740,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
            (void *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730),
            (void *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728),0);
        act((char *)in_stack_ffffffffffffb740,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
            (void *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730),
            (void *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728),0);
        bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
        if ((((!bVar3) &&
             (bVar3 = is_npc((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728)), !bVar3)
             ) && (bVar3 = is_immortal((CHAR_DATA *)
                                       CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728)
                                      ), !bVar3)) &&
           (bVar3 = is_immortal((CHAR_DATA *)
                                CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728)),
           !bVar3)) {
          CSQLInterface::Insert
                    (&RS.SQL,"theft(ch, victim, obj, success) values(\'%s\',\'%s\',\'none\',0)",
                     local_8->true_name,local_3620->true_name);
        }
        iVar4 = number_range(in_stack_ffffffffffffb730,in_stack_ffffffffffffb72c);
        switch(iVar4) {
        case 0:
          pcVar7 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730));
          sprintf(local_1218,"%s is a lousy thief!",pcVar7);
          break;
        case 1:
          pcVar7 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730));
          if (local_8->sex == 2) {
            local_4878 = "her";
          }
          else {
            local_4878 = "his";
          }
          sprintf(local_1218,"%s couldn\'t rob %s way out of a paper bag!",pcVar7,local_4878);
          break;
        case 2:
          pcVar7 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730));
          sprintf(local_1218,"%s tried to rob me!",pcVar7);
          break;
        case 3:
          pcVar7 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730));
          sprintf(local_1218,"Keep your hands out of there, %s!",pcVar7);
        }
        bVar3 = is_awake(local_3620);
        if ((bVar3) &&
           (bVar3 = is_npc((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728)), !bVar3))
        {
          do_yell(in_stack_ffffffffffffc980,
                  (char *)CONCAT44(in_stack_ffffffffffffc97c,in_stack_ffffffffffffc978));
        }
        bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
        if (bVar3) {
          return;
        }
        bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
        if ((bVar3) && (bVar3 = is_awake(local_3620), bVar3)) {
          multi_hit(in_stack_ffffffffffffb960,in_stack_ffffffffffffb958,in_stack_ffffffffffffb954);
          return;
        }
        sprintf(local_1218,"$N tried to steal from %s.",local_3620->name);
        wiznet(in_stack_ffffffffffffc9a0,in_stack_ffffffffffffc998,in_stack_ffffffffffffc990,
               in_stack_ffffffffffffc988,(long)in_stack_ffffffffffffc980,in_stack_ffffffffffffc97c);
        return;
      }
      bVar3 = str_cmp(local_2418,"coin");
      if (((!bVar3) || (bVar3 = str_cmp(local_2418,"coins"), !bVar3)) ||
         (bVar3 = str_cmp(local_2418,"gold"), !bVar3)) {
        if (local_3620->gold < 0x65) {
          local_4840 = (uint)local_3620->gold;
        }
        else {
          local_4840 = number_range(in_stack_ffffffffffffb730,in_stack_ffffffffffffb72c);
        }
        if ((int)local_4840 < 1) {
          send_to_char((char *)in_stack_ffffffffffffb740,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
          return;
        }
        local_8->gold = (long)(int)local_4840 + local_8->gold;
        local_3620->gold = local_3620->gold - (long)(int)local_4840;
        sprintf(local_1218,"Bingo!  You got %d gold coins.\n\r",(ulong)local_4840);
        bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
        if (((!bVar3) &&
            (bVar3 = is_npc((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728)), !bVar3))
           && ((bVar3 = is_immortal((CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728)),
               !bVar3 && (bVar3 = is_immortal((CHAR_DATA *)
                                              CONCAT44(in_stack_ffffffffffffb72c,
                                                       in_stack_ffffffffffffb728)), !bVar3)))) {
          CSQLInterface::Insert
                    (&RS.SQL,"theft(ch, victim, obj, success) values(\'%s\',\'%s\',\'%d\',1)",
                     local_8->true_name,local_3620->true_name,(ulong)local_4840);
        }
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        check_improve(in_stack_ffffffffffffb810,in_stack_ffffffffffffb80c,
                      (bool)in_stack_ffffffffffffb80b,in_stack_ffffffffffffb804);
        bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
        if (!bVar3) {
          return;
        }
        if ((local_3620->stolen_from & 1U) != 0) {
          return;
        }
        local_3620->stolen_from = true;
        return;
      }
      local_3628 = get_obj_carry(in_stack_ffffffffffffc948,in_stack_ffffffffffffc940,
                                 in_stack_ffffffffffffc938);
      if (local_3628 == (OBJ_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        return;
      }
      bVar3 = can_drop_obj((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
                           (OBJ_DATA *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730)
                          );
      if ((!bVar3) ||
         (uVar2 = local_3628->extra_flags[0], _Var9 = std::pow<int,int>(0,0x57b3ab),
         (uVar2 & (long)_Var9) != 0)) {
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        return;
      }
      sVar1 = local_8->carry_number;
      iVar4 = get_obj_number(local_3628);
      iVar5 = can_carry_n((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738)
                         );
      if (iVar5 < sVar1 + iVar4) {
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        return;
      }
      iVar5 = (int)local_8->carry_weight;
      iVar4 = get_obj_weight((OBJ_DATA *)
                             CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730));
      iVar5 = iVar5 + iVar4;
      iVar4 = can_carry_w((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738)
                         );
      if (iVar4 < iVar5) {
        send_to_char((char *)in_stack_ffffffffffffb740,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
        return;
      }
      obj_from_char(in_stack_ffffffffffffb750);
      obj_to_char((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730),
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
      check_improve(in_stack_ffffffffffffb810,in_stack_ffffffffffffb80c,
                    (bool)in_stack_ffffffffffffb80b,in_stack_ffffffffffffb804);
      bVar3 = is_affected(local_3620,(int)gsn_accumulate_heat);
      if (bVar3) {
        act((char *)in_stack_ffffffffffffb740,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
            (void *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730),
            (void *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728),0);
        act((char *)in_stack_ffffffffffffb740,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
            (void *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730),
            (void *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728),0);
        dice(in_stack_ffffffffffffb730,in_stack_ffffffffffffb72c);
        in_stack_ffffffffffffb728 = 0;
        in_stack_ffffffffffffb730 = 0;
        in_stack_ffffffffffffb738 = 1;
        in_stack_ffffffffffffb740 = (char_data *)0x0;
        damage_new(in_stack_ffffffffffffcab8,in_stack_ffffffffffffcab0,in_stack_ffffffffffffcaac,
                   in_stack_ffffffffffffcaa8,in_stack_ffffffffffffcaa4,
                   (bool)in_stack_ffffffffffffcaa3,(bool)in_stack_ffffffffffffcaa2,
                   in_stack_ffffffffffffcad8,in_stack_ffffffffffffcae0,in_stack_ffffffffffffcae8);
      }
      act((char *)in_stack_ffffffffffffb740,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738),
          (void *)CONCAT44(in_stack_ffffffffffffb734,in_stack_ffffffffffffb730),
          (void *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728),0);
      bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
      if (bVar3) {
        return;
      }
      bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728));
      if (bVar3) {
        return;
      }
      bVar3 = is_immortal((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728)
                         );
      if (bVar3) {
        return;
      }
      bVar3 = is_immortal((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb72c,in_stack_ffffffffffffb728)
                         );
      if (bVar3) {
        return;
      }
      CSQLInterface::Insert
                (&RS.SQL,"theft(ch, victim, obj, success) values(\'%s\',\'%s\',\'%s\',1)",
                 local_8->true_name,local_3620->true_name,local_3628->short_descr);
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffb740,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb73c,in_stack_ffffffffffffb738));
  return;
}

Assistant:

void do_steal(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	int chance;
	char query[MSL];

	if (get_skill(ch, gsn_steal) == 0 || ch->level < skill_table[gsn_steal].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Steal what from whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg2);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("That's pointless.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (victim->fighting != nullptr)
	{
		send_to_char("You can't get close enough in the fray!\n\r", ch);
		return;
	}

	if (is_cabal_guard(victim))
	{
		send_to_char("You can't do that.\n\r", ch);
		return;
	}

	check_keen_vision(ch, victim);

	WAIT_STATE(ch, skill_table[gsn_steal].beats);

	chance = get_skill(ch, gsn_steal);
	chance /= 2;
	chance += 5 * (get_curr_stat(ch, STAT_DEX) - 20);

	if (is_npc(victim))
		chance -= 5 * (victim->level - ch->level);
	else
		chance -= 2 * (victim->level - ch->level);

	if (can_see(victim, ch))
		chance -= 25;
	else
		chance += 5;

	if (!is_affected_by(ch, AFF_SNEAK))
		chance -= 10;

	if (!is_awake(victim))
		chance += 25;
	else
		chance -= 2 * (get_curr_stat(victim, STAT_DEX) - 15);

	if (ch->Class()->name == "anti-paladin")
		chance = std::max(40, chance);

	if (is_npc(victim) && victim->pIndexData->pShop)
		chance = 0;

	if (get_trust(ch) >= 59)
		chance = 100;

	if (number_percent() > chance)
	{
		/*
		 * Failure.
		 */
		send_to_char("Oops.\n\r", ch);

		affect_strip(ch, gsn_sneak);

		REMOVE_BIT(ch->affected_by, AFF_SNEAK);

		check_improve(ch, gsn_steal, false, 2);

		act("$n tried to steal from you.\n\r", ch, nullptr, victim, TO_VICT);
		act("$n tried to steal from $N.\n\r", ch, nullptr, victim, TO_NOTVICT);

		if (!is_npc(ch) && !is_npc(victim) && !is_immortal(ch) && !is_immortal(victim))
			RS.SQL.Insert("theft(ch, victim, obj, success) values('%s','%s','none',0)", ch->true_name, victim->true_name);

		switch (number_range(0, 3))
		{
			case 0:
				sprintf(buf, "%s is a lousy thief!", pers(ch, victim));
				break;
			case 1:
				sprintf(buf, "%s couldn't rob %s way out of a paper bag!",
					pers(ch, victim), 
					(ch->sex == 2) ? "her" : "his");
				break;
			case 2:
				sprintf(buf, "%s tried to rob me!", pers(ch, victim));
				break;
			case 3:
				sprintf(buf, "Keep your hands out of there, %s!", pers(ch, victim));
				break;
		}

		if (is_awake(victim) && !is_npc(victim))
			do_yell(victim, buf);

		if (!is_npc(ch))
		{
			if (is_npc(victim) && is_awake(victim))
			{
				multi_hit(victim, ch, TYPE_UNDEFINED);
			}
			else
			{
				sprintf(buf, "$N tried to steal from %s.", victim->name);
				wiznet(buf, ch, nullptr, WIZ_FLAGS, 0, 0);
			}
		}

		return;
	}

	if (!str_cmp(arg1, "coin") || !str_cmp(arg1, "coins") || !str_cmp(arg1, "gold"))
	{
		int gold;

		if (victim->gold <= 100)
			gold = victim->gold;
		else
			gold = number_range((int)(victim->gold / 8), victim->gold);

		if (gold <= 0)
		{
			send_to_char("You couldn't get any coins.\n\r", ch);
			return;
		}

		ch->gold += gold;
		victim->gold -= gold;

		sprintf(buf, "Bingo!  You got %d gold coins.\n\r", gold);

		if (!is_npc(ch) && !is_npc(victim) && !is_immortal(ch) && !is_immortal(victim))
		{
			RS.SQL.Insert("theft(ch, victim, obj, success) values('%s','%s','%d',1)",
				ch->true_name,
				victim->true_name,
				gold);
		}

		send_to_char(buf, ch);
		check_improve(ch, gsn_steal, true, 2);

		if (is_npc(victim) && !victim->stolen_from)
			victim->stolen_from = true;

		return;
	}

	obj = get_obj_carry(victim, arg1, ch);

	if (obj == nullptr)
	{
		send_to_char("You can't find it.\n\r", ch);
		return;
	}

	if (!can_drop_obj(ch, obj) || IS_SET(obj->extra_flags, ITEM_INVENTORY))
	{
		send_to_char("You can't pry it away.\n\r", ch);
		return;
	}

	if (ch->carry_number + get_obj_number(obj) > can_carry_n(ch))
	{
		send_to_char("You have your hands full.\n\r", ch);
		return;
	}

	if (ch->carry_weight + get_obj_weight(obj) > can_carry_w(ch))
	{
		send_to_char("You can't carry that much weight.\n\r", ch);
		return;
	}

	obj_from_char(obj);
	obj_to_char(obj, ch);
	check_improve(ch, gsn_steal, true, 2);

	if (is_affected(victim, gsn_accumulate_heat))
	{
		act("As you grab for $p you are burned!", ch, obj, victim, TO_CHAR);
		act("As $n grabs for $p, $e is burned!", ch, obj, victim, TO_VICT);
		damage_new(victim, ch, dice(4, 6), gsn_burning_hands, DAM_FIRE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
	}

	act("You steal $p from $N.", ch, obj, victim, TO_CHAR);

	if (!is_npc(ch) && !is_npc(victim) && !is_immortal(ch) && !is_immortal(victim))
	{
		RS.SQL.Insert("theft(ch, victim, obj, success) values('%s','%s','%s',1)",
			ch->true_name,
			victim->true_name,
			obj->short_descr);
	}
}